

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O0

Object * __thiscall
nvim::Nvim::get_proc_abi_cxx11_(Object *__return_storage_ptr__,Nvim *this,Integer pid)

{
  allocator local_49;
  string local_48;
  undefined1 local_21;
  Integer local_20;
  Integer pid_local;
  Nvim *this_local;
  Object *res;
  
  local_21 = 0;
  local_20 = pid;
  pid_local = (Integer)this;
  this_local = (Nvim *)__return_storage_ptr__;
  msgpack::v1::type::
  basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>
  ::basic_variant(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"nvim_get_proc",&local_49);
  NvimRPC::call<long>(&this->client_,&local_48,__return_storage_ptr__,&local_20);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return __return_storage_ptr__;
}

Assistant:

Object Nvim::get_proc(Integer pid) {
    Object res;
    client_.call("nvim_get_proc", res, pid);
    return res;
}